

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-read.c
# Opt level: O1

int mp3_next_frame(file_t *mp3,mp3_frame_t *frame)

{
  uint uVar1;
  int iVar2;
  size_t size;
  uint uVar3;
  uchar *buf;
  
  if (mp3 == (file_t *)0x0) {
    __assert_fail("mp3 != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x301,
                  "int mp3_next_frame(file_t *, mp3_frame_t *)");
  }
  if (frame == (mp3_frame_t *)0x0) {
    __assert_fail("frame != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x302,
                  "int mp3_next_frame(file_t *, mp3_frame_t *)");
  }
  uVar1 = 0;
LAB_001020c6:
  do {
    uVar3 = uVar1;
    if (uVar3 == 0) {
      size = 4;
      buf = frame->raw;
    }
    else {
      *(undefined2 *)frame->raw = *(undefined2 *)(frame->raw + 1);
      frame->raw[2] = frame->raw[3];
      size = 1;
      buf = frame->raw + 3;
    }
    iVar2 = file_read(mp3,buf,size);
    if (iVar2 < 1) {
      return -1;
    }
    if (frame->raw[0] == 'I') {
      if ((frame->raw[1] == 'D') && (frame->raw[2] == '3')) {
        iVar2 = mp3_skip_id3v2(mp3,frame);
        uVar1 = 0;
        if (iVar2 != 0) goto LAB_001020c6;
      }
    }
    else if (((frame->raw[0] == 0xff) && (0xdf < frame->raw[1])) &&
            (iVar2 = mp3_read_hdr(frame), iVar2 != 0)) {
      uVar3 = 0;
      if (frame->frame_size < 0xfa1) {
        iVar2 = file_read(mp3,frame->raw + 4,frame->frame_size - 4);
        if (iVar2 < 1) {
          return -1;
        }
        iVar2 = mp3_read_si(frame);
        uVar1 = 0;
        if (iVar2 != 0) {
          return 1;
        }
        goto LAB_001020c6;
      }
    }
    frame->syncskip = frame->syncskip + 1;
    uVar1 = uVar3 + 1;
    if (4000 < uVar3) {
      fprintf(_stderr,"Max sync exceeded: %d\n");
      return -2;
    }
  } while( true );
}

Assistant:

int mp3_next_frame(file_t *mp3, mp3_frame_t *frame) {
  assert(mp3 != NULL);
  assert(frame != NULL);

  unsigned int resync = 0;
  again:
  if (resync != 0) {
    /* read the next byte and build the new header */
    frame->raw[0] = frame->raw[1];
    frame->raw[1] = frame->raw[2];
    frame->raw[2] = frame->raw[3];

    if (file_read(mp3, frame->raw + 3, 1) <= 0)
      return EEOF;
  } else {
    if (file_read(mp3, frame->raw, MP3_HDR_SIZE) <= 0)
      return EEOF;
  }

  if ((frame->raw[0] == 0xFF) &&
      (((unsigned char) (frame->raw[1] >> 5) & 0x7u) == 0x7)) {
    if (!mp3_read_hdr(frame))
      goto resync;
    else
      resync = 0;
  } else if ((frame->raw[0] == 'I') &&
             (frame->raw[1] == 'D') &&
             (frame->raw[2] == '3')) {
    if (!mp3_skip_id3v2(mp3, frame)) {
      goto resync;
    } else {
      resync = 0;
      goto again;
    }
  } else {
    goto resync;
  }

  if (frame->frame_size > MP3_RAW_SIZE)
    goto resync;

  if (file_read(mp3, frame->raw + 4, frame->frame_size - 4) <= 0)
    return EEOF;

  if (!mp3_read_si(frame))
    goto again;

  return 1;

  resync:
  frame->syncskip++;
  if (resync++ > MP3_MAX_SYNC) {
    fprintf(stderr, "Max sync exceeded: %d\n", resync);
    return ESYNC;
  } else
    goto again;
}